

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *
qSelectionPersistentRowLengths
          (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *__return_storage_ptr__,
          QItemSelection *sel)

{
  int acolumn;
  bool bVar1;
  int iVar2;
  QItemSelectionRange *pQVar3;
  QAbstractItemModel *pQVar4;
  int arow;
  QItemSelectionRange *range;
  QItemSelectionRange *this;
  long in_FS_OFFSET;
  uint width;
  QModelIndex local_78;
  uint local_5c;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this = (sel->super_QList<QItemSelectionRange>).d.ptr;
  pQVar3 = this + (sel->super_QList<QItemSelectionRange>).d.size;
  for (; this != pQVar3; this = this + 1) {
    bVar1 = QItemSelectionRange::isValid(this);
    if (bVar1) {
      pQVar4 = QPersistentModelIndex::model(&this->tl);
      if (pQVar4 != (QAbstractItemModel *)0x0) {
        local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&this->tl);
        iVar2 = QPersistentModelIndex::row(&this->br);
        local_5c = QItemSelectionRange::width(this);
        acolumn = local_58._4_4_;
        for (arow = (int)local_58; arow <= iVar2; arow = arow + 1) {
          QModelIndex::sibling(&local_78,(QModelIndex *)&local_58,arow,acolumn);
          QList<std::pair<QPersistentModelIndex,unsigned_int>>::
          emplaceBack<QModelIndex,unsigned_int_const&>
                    ((QList<std::pair<QPersistentModelIndex,unsigned_int>> *)__return_storage_ptr__,
                     &local_78,&local_5c);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<std::pair<QPersistentModelIndex, uint>> qSelectionPersistentRowLengths(const QItemSelection &sel)
{
    QList<std::pair<QPersistentModelIndex, uint>> result;
    for (const QItemSelectionRange &range : sel)
        rowLengthsFromRange(range, result);
    return result;
}